

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O2

IterateResult __thiscall
gl4cts::DirectStateAccess::Textures::LevelParameterErrorsTest::iterate
          (LevelParameterErrorsTest *this)

{
  int iVar1;
  ulong uVar2;
  bool bVar3;
  bool bVar4;
  char cVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  int iVar14;
  ContextType ctxType;
  deUint32 dVar15;
  undefined4 extraout_var;
  int *piVar17;
  char *description;
  qpTestResult testResult;
  ulong uVar18;
  ErrorsUtilities *pEVar19;
  TestContext *this_00;
  uint uVar20;
  GLuint texture_2D;
  GLint max_level;
  GLint storei [4];
  GLfloat storef [4];
  long lVar16;
  
  iVar14 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar16 = CONCAT44(extraout_var,iVar14);
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar3 = glu::contextSupports(ctxType,(ApiType)0x154);
  bVar4 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_direct_state_access")
  ;
  if ((bVar3) || (bVar4)) {
    max_level = 0;
    storef[0] = 0.0;
    storef[1] = 0.0;
    storef[2] = 0.0;
    storef[3] = 0.0;
    storei[0] = 0;
    storei[1] = 0;
    storei[2] = 0;
    storei[3] = 0;
    (**(code **)(lVar16 + 0x6f8))(1);
    dVar15 = (**(code **)(lVar16 + 0x800))();
    glu::checkError(dVar15,"glGenTextures has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x3251);
    (**(code **)(lVar16 + 0xb8))(0xde1,0);
    dVar15 = (**(code **)(lVar16 + 0x800))();
    glu::checkError(dVar15,"glBindTexture has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x3254);
    (**(code **)(lVar16 + 0x1380))(0xde1,1,0x8229,1,1);
    dVar15 = (**(code **)(lVar16 + 0x800))();
    glu::checkError(dVar15,"glTexImage2D has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x3257);
    (**(code **)(lVar16 + 0x868))(0xd33,&max_level);
    dVar15 = (**(code **)(lVar16 + 0x800))();
    glu::checkError(dVar15,"glGetIntegerv has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x325b);
    uVar20 = 0;
    do {
      uVar20 = uVar20 + 1;
      cVar5 = (**(code **)(lVar16 + 0xcc8))(uVar20);
    } while (cVar5 != '\0');
    bVar3 = true;
    iVar14 = 0;
    while (bVar3) {
      iVar14 = iVar14 + 1;
      piVar17 = &DAT_017214c0;
      uVar2 = 0;
      do {
        uVar18 = uVar2;
        if (uVar18 == 0x17) break;
        iVar1 = *piVar17;
        piVar17 = piVar17 + 1;
        uVar2 = uVar18 + 1;
      } while (iVar1 != iVar14);
      bVar3 = uVar18 < 0x17;
    }
    pEVar19 = (ErrorsUtilities *)(ulong)uVar20;
    (**(code **)(lVar16 + 0xae0))(pEVar19,0,0x1000,storef);
    bVar3 = ErrorsUtilities::CheckErrorAndLog
                      (pEVar19,(this->super_TestCase).m_context,0x502,"glGetTextureLevelParameterfv"
                       ,"texture is not the name of an existing texture object.");
    pEVar19 = (ErrorsUtilities *)(ulong)uVar20;
    (**(code **)(lVar16 + 0xae8))(pEVar19,0,0x1000,storei);
    bVar4 = ErrorsUtilities::CheckErrorAndLog
                      (pEVar19,(this->super_TestCase).m_context,0x502,"glGetTextureLevelParameteriv"
                       ,"texture is not the name of an existing texture object.");
    pEVar19 = (ErrorsUtilities *)0x0;
    (**(code **)(lVar16 + 0xae0))(0,0xffffffffffffffff,0x1000,storef);
    bVar6 = ErrorsUtilities::CheckErrorAndLog
                      (pEVar19,(this->super_TestCase).m_context,0x501,"glGetTextureLevelParameterfv"
                       ,"level is less than 0.");
    pEVar19 = (ErrorsUtilities *)0x0;
    (**(code **)(lVar16 + 0xae8))(0,0xffffffffffffffff,0x1000,storei);
    bVar7 = ErrorsUtilities::CheckErrorAndLog
                      (pEVar19,(this->super_TestCase).m_context,0x501,"glGetTextureLevelParameteriv"
                       ,"level is less than 0.");
    pEVar19 = (ErrorsUtilities *)0x0;
    (**(code **)(lVar16 + 0xae0))(0,0,iVar14,storef);
    bVar8 = ErrorsUtilities::CheckErrorAndLog
                      (pEVar19,(this->super_TestCase).m_context,0x500,"glGetTextureLevelParameterfv"
                       ,"pname is not one of supported constants.");
    pEVar19 = (ErrorsUtilities *)0x0;
    (**(code **)(lVar16 + 0xae8))(0,0,iVar14,storei);
    bVar9 = ErrorsUtilities::CheckErrorAndLog
                      (pEVar19,(this->super_TestCase).m_context,0x500,"glGetTextureLevelParameteriv"
                       ,"pname is not one of supported constants.");
    pEVar19 = (ErrorsUtilities *)0x0;
    (**(code **)(lVar16 + 0xae0))(0,max_level,0x1000,storef);
    bVar10 = ErrorsUtilities::CheckErrorAndLog
                       (pEVar19,(this->super_TestCase).m_context,0x501,
                        "glGetTextureLevelParameterfv",
                        "level is greater than log2 max, where max is the returned value of MAX_TEXTURE_SIZE."
                       );
    pEVar19 = (ErrorsUtilities *)0x0;
    (**(code **)(lVar16 + 0xae8))(0,max_level,0x1000,storei);
    bVar11 = ErrorsUtilities::CheckErrorAndLog
                       (pEVar19,(this->super_TestCase).m_context,0x501,
                        "glGetTextureLevelParameteriv",
                        "level is greater than log2 max, where max is the returned value of MAX_TEXTURE_SIZE."
                       );
    pEVar19 = (ErrorsUtilities *)0x0;
    (**(code **)(lVar16 + 0xae0))(0,0,0x86a0,storef);
    bVar12 = ErrorsUtilities::CheckErrorAndLog
                       (pEVar19,(this->super_TestCase).m_context,0x502,
                        "glGetTextureLevelParameterfv",
                        "TEXTURE_COMPRESSED_IMAGE_SIZE is queried on texture images with an uncompressed internal format or on proxy targets."
                       );
    pEVar19 = (ErrorsUtilities *)0x0;
    (**(code **)(lVar16 + 0xae8))(0,0,0x86a0,storei);
    bVar13 = ErrorsUtilities::CheckErrorAndLog
                       (pEVar19,(this->super_TestCase).m_context,0x502,
                        "glGetTextureLevelParameteriv",
                        "TEXTURE_COMPRESSED_IMAGE_SIZE is queried on texture images with an uncompressed internal format or on proxy targets."
                       );
    do {
      iVar14 = (**(code **)(lVar16 + 0x800))();
    } while (iVar14 != 0);
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if (((((((((bVar3 && bVar4) && bVar6) && bVar7) && bVar8) && bVar9) && bVar10) && bVar11) &&
        bVar12) && bVar13) {
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
    else {
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
  }
  else {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult LevelParameterErrorsTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	/* Objects. */
	glw::GLuint texture_2D		= 0;
	glw::GLuint texture_invalid = 0;
	glw::GLint  max_level		= 0;
	glw::GLenum pname_invalid   = 0;

	glw::GLfloat storef[4] = {};
	glw::GLint   storei[4] = {};

	try
	{
		/* Preparations. */

		/* 2D texture */
		gl.genTextures(1, &texture_2D);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures has failed");

		gl.bindTexture(GL_TEXTURE_2D, texture_2D);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture has failed");

		gl.texStorage2D(GL_TEXTURE_2D, 1, GL_R8, 1, 1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glTexImage2D has failed");

		/* Limits. */
		gl.getIntegerv(GL_MAX_TEXTURE_SIZE, &max_level); /* assuming that x > log(x) */
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv has failed");

		/* invalid texture */
		while (gl.isTexture(++texture_invalid))
			;

		/* invalid pname */
		glw::GLenum all_pnames[] = { GL_TEXTURE_WIDTH,
									 GL_TEXTURE_HEIGHT,
									 GL_TEXTURE_DEPTH,
									 GL_TEXTURE_SAMPLES,
									 GL_TEXTURE_FIXED_SAMPLE_LOCATIONS,
									 GL_TEXTURE_INTERNAL_FORMAT,
									 GL_TEXTURE_RED_SIZE,
									 GL_TEXTURE_GREEN_SIZE,
									 GL_TEXTURE_BLUE_SIZE,
									 GL_TEXTURE_ALPHA_SIZE,
									 GL_TEXTURE_DEPTH_SIZE,
									 GL_TEXTURE_STENCIL_SIZE,
									 GL_TEXTURE_SHARED_SIZE,
									 GL_TEXTURE_RED_TYPE,
									 GL_TEXTURE_GREEN_TYPE,
									 GL_TEXTURE_BLUE_TYPE,
									 GL_TEXTURE_ALPHA_TYPE,
									 GL_TEXTURE_DEPTH_TYPE,
									 GL_TEXTURE_COMPRESSED,
									 GL_TEXTURE_COMPRESSED_IMAGE_SIZE,
									 GL_TEXTURE_BUFFER_DATA_STORE_BINDING,
									 GL_TEXTURE_BUFFER_OFFSET,
									 GL_TEXTURE_BUFFER_SIZE };

		glw::GLuint all_pnames_count = sizeof(all_pnames) / sizeof(all_pnames[0]);

		bool is_valid = true;

		while (is_valid)
		{
			is_valid = false;

			++pname_invalid;

			for (glw::GLuint i = 0; i < all_pnames_count; ++i)
			{
				if (all_pnames[i] == pname_invalid)
				{
					is_valid = true;

					break;
				}
			}
		}

		/* Tests. */

		/* Check that INVALID_OPERATION is generated by GetTextureLevelParameterfv
		 and GetTextureLevelParameteriv functions if texture is not the name of
		 an existing texture object. */
		gl.getTextureLevelParameterfv(texture_invalid, 0, GL_TEXTURE_WIDTH, storef);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glGetTextureLevelParameterfv",
								  "texture is not the name of an existing texture object.");

		gl.getTextureLevelParameteriv(texture_invalid, 0, GL_TEXTURE_WIDTH, storei);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glGetTextureLevelParameteriv",
								  "texture is not the name of an existing texture object.");

		/* Check that INVALID_VALUE is generated by GetTextureLevelParameter* if
		 level is less than 0. */
		gl.getTextureLevelParameterfv(texture_2D, -1, GL_TEXTURE_WIDTH, storef);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_VALUE, "glGetTextureLevelParameterfv", "level is less than 0.");

		gl.getTextureLevelParameteriv(texture_2D, -1, GL_TEXTURE_WIDTH, storei);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_VALUE, "glGetTextureLevelParameteriv", "level is less than 0.");

		/* Check that INVALID_ENUM error is generated by GetTextureLevelParameter*
		 if pname is not one of supported constants. */
		gl.getTextureLevelParameterfv(texture_2D, 0, pname_invalid, storef);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_ENUM, "glGetTextureLevelParameterfv",
								  "pname is not one of supported constants.");

		gl.getTextureLevelParameteriv(texture_2D, 0, pname_invalid, storei);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_ENUM, "glGetTextureLevelParameteriv",
								  "pname is not one of supported constants.");

		/* Check that INVALID_VALUE may be generated if level is greater than
		 log2 max, where max is the returned value of MAX_TEXTURE_SIZE. */
		gl.getTextureLevelParameterfv(texture_2D, max_level, GL_TEXTURE_WIDTH, storef);
		is_ok &=
			CheckErrorAndLog(m_context, GL_INVALID_VALUE, "glGetTextureLevelParameterfv",
							 "level is greater than log2 max, where max is the returned value of MAX_TEXTURE_SIZE.");

		gl.getTextureLevelParameteriv(texture_2D, max_level, GL_TEXTURE_WIDTH, storei);
		is_ok &=
			CheckErrorAndLog(m_context, GL_INVALID_VALUE, "glGetTextureLevelParameteriv",
							 "level is greater than log2 max, where max is the returned value of MAX_TEXTURE_SIZE.");

		/* Check that INVALID_OPERATION is generated by GetTextureLevelParameter*
		 if TEXTURE_COMPRESSED_IMAGE_SIZE is queried on texture images with an
		 uncompressed internal format or on proxy targets. */
		gl.getTextureLevelParameterfv(texture_2D, 0, GL_TEXTURE_COMPRESSED_IMAGE_SIZE, storef);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glGetTextureLevelParameterfv",
								  "TEXTURE_COMPRESSED_IMAGE_SIZE is queried on texture images with an uncompressed "
								  "internal format or on proxy targets.");

		gl.getTextureLevelParameteriv(texture_2D, 0, GL_TEXTURE_COMPRESSED_IMAGE_SIZE, storei);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glGetTextureLevelParameteriv",
								  "TEXTURE_COMPRESSED_IMAGE_SIZE is queried on texture images with an uncompressed "
								  "internal format or on proxy targets.");
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Cleanup. */
	if (texture_2D)
	{
		gl.deleteTextures(1, &texture_2D);
	}

	while (GL_NO_ERROR != gl.getError())
		;

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}